

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int max_connection;
  CFtpTransfer t;
  allocator local_2029;
  string local_2028;
  CFtpTransfer local_2008;
  
  if (argc == 4) {
    std::__cxx11::string::string((string *)&local_2028,argv[1],&local_2029);
    iVar1 = atoi(argv[2]);
    max_connection = atoi(argv[3]);
    CFtpTransfer::CFtpTransfer(&local_2008,&local_2028,iVar1,max_connection);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2028._M_dataplus._M_p != &local_2028.field_2) {
      operator_delete(local_2028._M_dataplus._M_p);
    }
    CTransfer::run(&local_2008.super_CTransfer);
    local_2008.super_CTransfer._vptr_CTransfer = (_func_int **)&PTR_Accept_0012d598;
    CManageClient::~CManageClient(&local_2008.m_ClientManager);
    CTransfer::~CTransfer(&local_2008.super_CTransfer);
    iVar1 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Please user SimpleFtpServer [ip] [port] [max_connection] to execute this program.",
               0x51);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc,char **argv) {
#ifndef _DEBUG
    if(argc != 4){
        cout << "Please user SimpleFtpServer [ip] [port] [max_connection] to execute this program." << endl;
        return -1;
    }
    CFtpTransfer t(argv[1],atoi(argv[2]),atoi(argv[3]));
#else
    CFtpTransfer t("0.0.0.0",5000,2);
#endif
    t.run();
    return 0;
}